

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.h
# Opt level: O2

char * asmjit::Support::findPackedString(char *p,uint32_t id)

{
  char cVar1;
  uint32_t i;
  uint32_t uVar2;
  
  for (uVar2 = 0; uVar2 != id; uVar2 = uVar2 + 1) {
    do {
      cVar1 = *p;
      p = p + 1;
    } while (cVar1 != '\0');
  }
  return p;
}

Assistant:

static ASMJIT_INLINE const char* findPackedString(const char* p, uint32_t id) noexcept {
  uint32_t i = 0;
  while (i < id) {
    while (p[0])
      p++;
    p++;
    i++;
  }
  return p;
}